

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O0

unsigned_long * CorUnix::InternalNewArray<unsigned_long>(size_t cElements)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  size_t __n;
  unsigned_long *pMem;
  size_t cbSize;
  size_t cElements_local;
  
  psVar2 = (size_t *)InternalMalloc(cElements * 8 + 8);
  if (psVar2 == (size_t *)0x0) {
    cElements_local = 0;
  }
  else {
    *psVar2 = cElements;
    cElements_local = (size_t)(psVar2 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = cElements;
    __n = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    memset((void *)cElements_local,0,__n);
  }
  return (unsigned_long *)cElements_local;
}

Assistant:

T* InternalNewArray(size_t cElements)
    {
        size_t cbSize = (cElements * sizeof(T)) + sizeof(size_t);
        T *pMem;

        pMem = (T*)InternalMalloc(cbSize);

        if (pMem == NULL)
            return NULL;

        *(size_t*)pMem = cElements;
        pMem = (T*)((size_t*)pMem + 1);

        return new (pMem) T[cElements]();
    }